

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O0

int __thiscall
vkt::memory::anon_unknown_0::FillBuffer::verify
          (FillBuffer *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  ReferenceMemory *this_00;
  ulong local_30;
  size_t ndx;
  ReferenceMemory_conflict *reference;
  size_t param_2_local;
  VerifyContext *context_local;
  FillBuffer *this_local;
  
  this_00 = (ReferenceMemory *)VerifyContext::getReference((VerifyContext *)ctx);
  for (local_30 = 0; local_30 < this->m_bufferSize; local_30 = local_30 + 1) {
    ReferenceMemory::set(this_00,local_30,(deUint8)(this->m_value >> (sbyte)((local_30 & 3) << 3)));
  }
  return (int)local_30;
}

Assistant:

void FillBuffer::verify (VerifyContext& context, size_t)
{
	ReferenceMemory&	reference	= context.getReference();

	for (size_t ndx = 0; ndx < m_bufferSize; ndx++)
	{
#if (DE_ENDIANNESS == DE_LITTLE_ENDIAN)
		reference.set(ndx, (deUint8)(0xffu & (m_value >> (8*(ndx % 4)))));
#else
		reference.set(ndx, (deUint8)(0xffu & (m_value >> (8*(3 - (ndx % 4))))));
#endif
	}
}